

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void lj_err_run(lua_State *L)

{
  uint *puVar1;
  uint uVar2;
  TValue *pTVar3;
  GCstr *pGVar4;
  TValue *pTVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  
  pTVar5 = L->base + -1;
  pTVar3 = (TValue *)(ulong)(L->stack).ptr32;
  pvVar6 = L->cframe;
  if (pvVar6 != (void *)0x0 && pTVar3 < pTVar5) {
    do {
      if ((*(int *)(((ulong)pvVar6 & 0xfffffffffffffffc) + 0x10) < 0) &&
         (pTVar5 < (TValue *)((long)pTVar3 - (long)*(int *)((long)pvVar6 + 0x10)))) {
        lVar8 = (long)*(int *)((long)pvVar6 + 0x14);
        if (-1 < lVar8) goto LAB_0010a386;
        pvVar6 = *(void **)((long)pvVar6 + 0x20);
      }
      else {
        uVar2 = (pTVar5->field_2).it;
        switch(uVar2 & 7) {
        default:
          pTVar5 = pTVar5 + (-1 - (ulong)*(byte *)((ulong)uVar2 - 3));
          goto LAB_0010a36f;
        case 1:
          pvVar6 = *(void **)((long)pvVar6 + 0x20);
          break;
        case 2:
          if (pTVar5[-1].u32.lo == 1) {
            pvVar6 = *(void **)((long)pvVar6 + 0x20);
          }
          uVar7 = (ulong)(int)(uVar2 & 0xfffffff8);
          goto LAB_0010a36c;
        case 3:
          break;
        case 5:
          if (((ulong)pvVar6 & 1) != 0) goto LAB_0010a38b;
          lVar8 = (long)*(int *)((long)pvVar6 + 0x14);
          if (-1 < lVar8) goto LAB_0010a386;
          break;
        case 6:
        case 7:
          if (0xf < (int)uVar2) {
            lVar8 = (long)pTVar5 + (-8 - (long)pTVar3);
LAB_0010a386:
            if (lVar8 != 0) {
              pTVar5 = L->top;
              puVar1 = (uint *)((ulong)(L->glref).ptr32 + 0x254);
              *puVar1 = *puVar1 & 0xffffffef;
              if ((*(int *)((long)pTVar3 + lVar8 + 4) != -9) || (L->status == '\x05')) {
                pGVar4 = lj_err_str(L,LJ_ERR_ERRERR);
                pTVar5[-1].u32.lo = (uint32_t)pGVar4;
                *(undefined4 *)((long)pTVar5 + -4) = 0xfffffffb;
                lj_err_throw(L,5);
              }
              L->status = '\x05';
              *pTVar5 = pTVar5[-1];
              pTVar5[-1] = *(TValue *)((long)pTVar3 + lVar8);
              L->top = pTVar5 + 1;
              lj_vm_call(L,pTVar5,2);
            }
          }
          goto LAB_0010a38b;
        }
        uVar7 = (long)(int)uVar2 & 0xfffffffffffffff8;
LAB_0010a36c:
        pTVar5 = (TValue *)((long)pTVar5 - uVar7);
LAB_0010a36f:
        if (pTVar5 <= pTVar3) break;
      }
    } while (pvVar6 != (void *)0x0);
  }
LAB_0010a38b:
  lj_err_throw(L,2);
}

Assistant:

LJ_NOINLINE void lj_err_run(lua_State *L)
{
  ptrdiff_t ef = finderrfunc(L);
  if (ef) {
    TValue *errfunc = restorestack(L, ef);
    TValue *top = L->top;
    lj_trace_abort(G(L));
    if (!tvisfunc(errfunc) || L->status == LUA_ERRERR) {
      setstrV(L, top-1, lj_err_str(L, LJ_ERR_ERRERR));
      lj_err_throw(L, LUA_ERRERR);
    }
    L->status = LUA_ERRERR;
    copyTV(L, top, top-1);
    copyTV(L, top-1, errfunc);
    L->top = top+1;
    lj_vm_call(L, top, 1+1);  /* Stack: |errfunc|msg| -> |msg| */
  }
  lj_err_throw(L, LUA_ERRRUN);
}